

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

CTypeID argv2ctype(jit_State *J,TRef tr,cTValue *o)

{
  uint uVar1;
  ulong uVar2;
  TRef TVar3;
  int iVar4;
  CTypeID CVar5;
  GCcdata *cd;
  CPState cp;
  
  if ((tr & 0x1f000000) == 0x4000000) {
    uVar2 = o->u64;
    TVar3 = lj_ir_kgc(J,(GCobj *)(uVar2 & 0x7fffffffffff),IRT_STR);
    (J->fold).ins.field_0.ot = 0x884;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
    cp.L = J->L;
    cp.cts = *(CTState **)(((cp.L)->glref).ptr64 + 0x180);
    (cp.cts)->L = cp.L;
    uVar1 = (cp.cts)->top;
    cp.p = (char *)&(((GCobj *)(uVar2 & 0x7fffffffffff))->ud).len;
    cp.param = (TValue *)0x0;
    cp.mode = 0x12;
    cp.srcname = cp.p;
    iVar4 = lj_cparse(&cp);
    if ((iVar4 != 0) || (uVar1 < (cp.cts)->top)) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
  }
  else {
    cd = argv2cdata(J,tr,o);
    cp.val.id = (CTypeID)cd->ctypeid;
    if (cp.val.id == 0x16) {
      CVar5 = crec_constructor(J,cd,tr);
      return CVar5;
    }
  }
  return cp.val.id;
}

Assistant:

static CTypeID argv2ctype(jit_State *J, TRef tr, cTValue *o)
{
  if (tref_isstr(tr)) {
    GCstr *s = strV(o);
    CPState cp;
    CTypeID oldtop;
    /* Specialize to the string containing the C type declaration. */
    emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, s));
    cp.L = J->L;
    cp.cts = ctype_cts(J->L);
    oldtop = cp.cts->top;
    cp.srcname = strdata(s);
    cp.p = strdata(s);
    cp.param = NULL;
    cp.mode = CPARSE_MODE_ABSTRACT|CPARSE_MODE_NOIMPLICIT;
    if (lj_cparse(&cp) || cp.cts->top > oldtop)  /* Avoid new struct defs. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    return cp.val.id;
  } else {
    GCcdata *cd = argv2cdata(J, tr, o);
    return cd->ctypeid == CTID_CTYPEID ? crec_constructor(J, cd, tr) :
					cd->ctypeid;
  }
}